

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# each.cpp
# Opt level: O1

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_9(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  type t;
  ResultBuilder DOCTEST_RB;
  bool local_ed;
  ExpressionDecomposer local_ec;
  Result local_e8;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  undefined1 *local_b0;
  Enum local_a8;
  ResultBuilder local_a0;
  
  local_c8 = 0x2a;
  local_c0 = 0x40091eb851eb851f;
  local_b8[0] = 1;
  doctest::String::String((String *)&local_e8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/tuple/view.cpp"
             ,0x35,"std::get<1>(l) == true","",(String *)&local_e8);
  doctest::String::~String((String *)&local_e8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_ec,DT_CHECK);
  local_b0 = local_b8;
  local_a8 = local_ec.m_at;
  local_ed = true;
  doctest::detail::Expression_lhs<bool_const&>::operator==
            (&local_e8,(Expression_lhs<bool_const&> *)&local_b0,&local_ed);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_e8);
  doctest::String::~String(&local_e8.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  return;
}

Assistant:

auto operator () (T t) const
        {
            ++calls;
            return t * t;
        }